

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testQueue.cpp
# Opt level: O2

int test1(void)

{
  bool bVar1;
  initializer_list<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> __l;
  initializer_list<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> __l_00;
  thread consumer4Thr;
  thread consumer3Thr;
  thread consumer2Thr;
  reference_wrapper<rtb::Concurrency::Queue<int>_> local_1e0;
  thread consumer1Thr;
  thread prodThr;
  Producer prod;
  reference_wrapper<rtb::Concurrency::Queue<int>_> local_1b0;
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  unsubscribeTime;
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  subscribeTime;
  Consumer cons4;
  Consumer cons3;
  Consumer cons2;
  Consumer cons1;
  duration<long,_std::ratio<1L,_1000L>_> local_f8;
  int local_ec;
  Queue<int> q;
  
  std::operator<<((ostream *)&std::cout,"\n ---------------- First Test ---------------- \n");
  std::operator<<((ostream *)&std::cout,"OUTPUT:  all the consumers read 100 messages\n\n");
  q.queue_.super__List_base<std::optional<int>,_std::allocator<std::optional<int>_>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)0x5;
  __l._M_len = 1;
  __l._M_array = (iterator)&q;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::vector(&subscribeTime,__l,(allocator_type *)&unsubscribeTime);
  q.queue_.super__List_base<std::optional<int>,_std::allocator<std::optional<int>_>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)0x5dc;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&q;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::vector(&unsubscribeTime,__l_00,(allocator_type *)&prod);
  rtb::Concurrency::Queue<int>::Queue(&q);
  prod.producedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  prod.producedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  prod.producedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  cons1.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  cons1.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  cons1.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  cons2.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  cons2.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  cons2.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  cons3.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  cons3.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  cons3.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  cons4.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  cons4.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  cons4.consumedValues.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  consumer3Thr._M_id._M_thread = (id)10;
  consumer4Thr._M_id._M_thread = (id)10;
  local_1e0._M_data._0_4_ = 100;
  consumer2Thr._M_id._M_thread = (id)(id)&q;
  consumer1Thr._M_id._M_thread = (id)(id)&prod;
  std::thread::
  thread<std::reference_wrapper<Producer>,std::reference_wrapper<rtb::Concurrency::Queue<int>>,std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::duration<long,std::ratio<1l,1000l>>,int,void>
            (&prodThr,(reference_wrapper<Producer> *)&consumer1Thr,
             (reference_wrapper<rtb::Concurrency::Queue<int>_> *)&consumer2Thr,
             (duration<long,_std::ratio<1L,_1000L>_> *)&consumer3Thr,
             (duration<long,_std::ratio<1L,_1000L>_> *)&consumer4Thr,(int *)&local_1e0);
  consumer2Thr._M_id._M_thread = (id)&cons1;
  local_1e0._M_data._0_4_ = 1;
  consumer4Thr._M_id._M_thread = (id)0;
  consumer3Thr._M_id._M_thread = (id)(id)&q;
  std::thread::
  thread<std::reference_wrapper<Consumer>,std::reference_wrapper<rtb::Concurrency::Queue<int>>,int,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::chrono::duration<long,std::ratio<1l,1000l>>,void>
            (&consumer1Thr,(reference_wrapper<Consumer> *)&consumer2Thr,
             (reference_wrapper<rtb::Concurrency::Queue<int>_> *)&consumer3Thr,(int *)&local_1e0,
             &subscribeTime,&unsubscribeTime,(duration<long,_std::ratio<1L,_1000L>_> *)&consumer4Thr
            );
  consumer3Thr._M_id._M_thread = (id)&cons2;
  local_1b0._M_data._0_4_ = 2;
  local_1e0._M_data = (Queue<int> *)0x0;
  consumer4Thr._M_id._M_thread = (id)(id)&q;
  std::thread::
  thread<std::reference_wrapper<Consumer>,std::reference_wrapper<rtb::Concurrency::Queue<int>>,int,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::chrono::duration<long,std::ratio<1l,1000l>>,void>
            (&consumer2Thr,(reference_wrapper<Consumer> *)&consumer3Thr,
             (reference_wrapper<rtb::Concurrency::Queue<int>_> *)&consumer4Thr,(int *)&local_1b0,
             &subscribeTime,&unsubscribeTime,(duration<long,_std::ratio<1L,_1000L>_> *)&local_1e0);
  consumer4Thr._M_id._M_thread = (id)&cons3;
  local_f8.__r._0_4_ = 3;
  local_1b0._M_data = (Queue<int> *)0x0;
  local_1e0._M_data = &q;
  std::thread::
  thread<std::reference_wrapper<Consumer>,std::reference_wrapper<rtb::Concurrency::Queue<int>>,int,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::chrono::duration<long,std::ratio<1l,1000l>>,void>
            (&consumer3Thr,(reference_wrapper<Consumer> *)&consumer4Thr,&local_1e0,(int *)&local_f8,
             &subscribeTime,&unsubscribeTime,(duration<long,_std::ratio<1L,_1000L>_> *)&local_1b0);
  local_1e0._M_data = (Queue<int> *)&cons4;
  local_ec = 4;
  local_f8.__r = 0;
  local_1b0._M_data = &q;
  std::thread::
  thread<std::reference_wrapper<Consumer>,std::reference_wrapper<rtb::Concurrency::Queue<int>>,int,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::vector<std::chrono::duration<long,std::ratio<1l,1000l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1000l>>>>&,std::chrono::duration<long,std::ratio<1l,1000l>>,void>
            (&consumer4Thr,(reference_wrapper<Consumer> *)&local_1e0,&local_1b0,&local_ec,
             &subscribeTime,&unsubscribeTime,&local_f8);
  std::thread::join();
  std::thread::join();
  std::thread::join();
  std::thread::join();
  std::thread::join();
  bVar1 = std::operator==(&prod.producedValues,&cons1.consumedValues);
  if (bVar1) {
    bVar1 = std::operator==(&prod.producedValues,&cons2.consumedValues);
    if (bVar1) {
      bVar1 = std::operator==(&prod.producedValues,&cons3.consumedValues);
      if (bVar1) {
        bVar1 = std::operator==(&prod.producedValues,&cons4.consumedValues);
        goto LAB_001026d5;
      }
    }
  }
  bVar1 = false;
LAB_001026d5:
  std::thread::~thread(&consumer4Thr);
  std::thread::~thread(&consumer3Thr);
  std::thread::~thread(&consumer2Thr);
  std::thread::~thread(&consumer1Thr);
  std::thread::~thread(&prodThr);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&cons4);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&cons3);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&cons2);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&cons1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&prod);
  rtb::Concurrency::Queue<int>::~Queue(&q);
  std::
  _Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::~_Vector_base(&unsubscribeTime.
                   super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                 );
  std::
  _Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  ::~_Vector_base(&subscribeTime.
                   super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
                 );
  return (uint)bVar1;
}

Assistant:

int test1() {
    // FIRST TEST
    // Producer start first (at 10) and send 100 msg with a period of 10
    // 4 Consumers subscribe before (at 5) and unsubscribe (at 1500)
    // OUTPUT: all the consumers should read everything

    std::cout << "\n ---------------- First Test ---------------- \n";
    std::cout << "OUTPUT:  all the consumers read 100 messages\n\n";

    std::vector<TimeT> subscribeTime = { TimeT{ 5 } };
    std::vector<TimeT> unsubscribeTime = { TimeT{ 1500 } };

    Queue<int> q;

    Producer prod;
    Consumer cons1, cons2, cons3, cons4;

    // producer thread
    std::thread prodThr(ref(prod), ref(q), TimeT{ 10 }, TimeT{ 10 }, 100);

    // consumer threads
    std::thread consumer1Thr(ref(cons1), ref(q), 1, subscribeTime, unsubscribeTime, TimeT{ 0 });
    std::thread consumer2Thr(ref(cons2), ref(q), 2, subscribeTime, unsubscribeTime, TimeT{ 0 });
    std::thread consumer3Thr(ref(cons3), ref(q), 3, subscribeTime, unsubscribeTime, TimeT{ 0 });
    std::thread consumer4Thr(ref(cons4), ref(q), 4, subscribeTime, unsubscribeTime, TimeT{ 0 });

    prodThr.join();
    consumer1Thr.join();
    consumer2Thr.join();
    consumer3Thr.join();
    consumer4Thr.join();

    bool areEqual = (prod.producedValues == cons1.consumedValues)
                    && (prod.producedValues == cons2.consumedValues)
                    && (prod.producedValues == cons3.consumedValues)
                    && (prod.producedValues == cons4.consumedValues);

    return areEqual;
}